

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O1

void Sle_ManCollectCutFaninsOne
               (Gia_Man_t *pGia,int iObj,Vec_Int_t *vCuts,Vec_Bit_t *vMask,Vec_Int_t *vCutFanins,
               Vec_Bit_t *vMap)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  uint *puVar9;
  ulong uVar10;
  
  if ((iObj < 0) || (vCuts->nSize <= iObj)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  piVar3 = vCuts->pArray;
  lVar7 = (long)piVar3[(uint)iObj];
  if ((lVar7 < 0) || (vCuts->nSize <= piVar3[(uint)iObj])) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  if (0 < piVar3[lVar7]) {
    puVar9 = (uint *)(piVar3 + lVar7 + 1);
    iVar8 = 0;
    do {
      uVar1 = *puVar9;
      if ((uVar1 & 0xf) < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                      ,0x17a,
                      "void Sle_ManCollectCutFaninsOne(Gia_Man_t *, int, Vec_Int_t *, Vec_Bit_t *, Vec_Int_t *, Vec_Bit_t *)"
                     );
      }
      uVar10 = 0;
      do {
        uVar2 = puVar9[uVar10 + 1];
        if (((int)uVar2 < 0) || (vMask->nSize <= (int)uVar2)) {
LAB_0079f935:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
        }
        uVar5 = uVar2 >> 5;
        uVar6 = uVar2 & 0x1f;
        if (((uint)vMask->pArray[uVar5] >> uVar6 & 1) != 0) {
          if (vMap->nSize <= (int)uVar2) goto LAB_0079f935;
          uVar2 = vMap->pArray[uVar5];
          if ((uVar2 >> uVar6 & 1) == 0) {
            vMap->pArray[uVar5] = uVar2 | 1 << uVar6;
            Vec_IntPush(vCutFanins,puVar9[uVar10 + 1]);
          }
        }
        uVar10 = uVar10 + 1;
      } while ((uVar1 & 0xf) != uVar10);
      iVar8 = iVar8 + 1;
      puVar9 = puVar9 + (ulong)(*puVar9 & 0xf) + 1;
    } while (iVar8 < piVar3[lVar7]);
  }
  if (0 < vCutFanins->nSize) {
    piVar3 = vCutFanins->pArray;
    lVar7 = 0;
    do {
      uVar1 = piVar3[lVar7];
      if (((int)uVar1 < 0) || (vMap->nSize <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      bVar4 = (byte)uVar1 & 0x1f;
      vMap->pArray[uVar1 >> 5] =
           vMap->pArray[uVar1 >> 5] & (-2 << bVar4 | 0xfffffffeU >> 0x20 - bVar4);
      lVar7 = lVar7 + 1;
    } while (lVar7 < vCutFanins->nSize);
  }
  return;
}

Assistant:

void Sle_ManCollectCutFaninsOne( Gia_Man_t * pGia, int iObj, Vec_Int_t * vCuts, Vec_Bit_t * vMask, Vec_Int_t * vCutFanins, Vec_Bit_t * vMap )
{
    int i, iFanin, * pCut, * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    Sle_ForEachCut( pList, pCut, i )
    {
        int nSize   = Sle_CutSize(pCut);
        int k, * pC = Sle_CutLeaves(pCut);
        assert( nSize > 1 );
        for ( k = 0; k < nSize; k++ )
            if ( Vec_BitEntry(vMask, pC[k]) && !Vec_BitEntry(vMap, pC[k]) )
            {
                Vec_BitWriteEntry( vMap, pC[k], 1 );
                Vec_IntPush( vCutFanins, pC[k] );
            }
    }
    Vec_IntForEachEntry( vCutFanins, iFanin, i )
        Vec_BitWriteEntry( vMap, iFanin, 0 );
}